

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixFetch(sqlite3_file *fd,i64 iOff,int nAmt,void **pp)

{
  int *piVar1;
  int iVar2;
  unixFile *pFd;
  
  *pp = (void *)0x0;
  if ((long)fd[0xc].pMethods < 1) {
    return 0;
  }
  if ((fd[0xd].pMethods == (sqlite3_io_methods *)0x0) &&
     (iVar2 = unixMapfile((unixFile *)fd,-1), iVar2 != 0)) {
    return iVar2;
  }
  if (nAmt + iOff <= (long)fd[10].pMethods) {
    *pp = (void *)((long)&(fd[0xd].pMethods)->iVersion + iOff);
    piVar1 = (int *)((long)&fd[9].pMethods + 4);
    *piVar1 = *piVar1 + 1;
  }
  return 0;
}

Assistant:

static int unixFetch(sqlite3_file *fd, i64 iOff, int nAmt, void **pp){
#if SQLITE_MAX_MMAP_SIZE>0
  unixFile *pFd = (unixFile *)fd;   /* The underlying database file */
#endif
  *pp = 0;

#if SQLITE_MAX_MMAP_SIZE>0
  if( pFd->mmapSizeMax>0 ){
    if( pFd->pMapRegion==0 ){
      int rc = unixMapfile(pFd, -1);
      if( rc!=SQLITE_OK ) return rc;
    }
    if( pFd->mmapSize >= iOff+nAmt ){
      *pp = &((u8 *)pFd->pMapRegion)[iOff];
      pFd->nFetchOut++;
    }
  }
#endif
  return SQLITE_OK;
}